

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

void __thiscall rudp::session::disconnect(session *this)

{
  int in_R8D;
  anon_class_24_2_f88cc66e local_58;
  function<void_(bool)> local_40;
  session *local_10;
  session *this_local;
  
  local_10 = this;
  generate_rst((session *)&stack0xffffffffffffffe0);
  local_58.this = this;
  std::enable_shared_from_this<rudp::session>::shared_from_this
            ((enable_shared_from_this<rudp::session> *)&local_58.this_);
  std::function<void(bool)>::function<rudp::session::disconnect()::__0,void>
            ((function<void(bool)> *)&local_40,&local_58);
  send(this,(int)&stack0xffffffffffffffe0,(void *)0x0,(size_t)&local_40,in_R8D);
  std::function<void_(bool)>::~function(&local_40);
  disconnect()::$_0::~__0((__0 *)&local_58);
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::~shared_ptr
            ((shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
             &stack0xffffffffffffffe0);
  return;
}

Assistant:

void session::disconnect() {
    send( generate_rst(), false, [this,this_=shared_from_this()]( bool ) {
      close();
    } );
  }